

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::stringPrintfRecursive<unsigned_int_const&>(string *s,char *fmt,uint *v)

{
  long lVar1;
  ulong uVar2;
  uint *in_RDX;
  string *in_RDI;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  uint *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffd90;
  char *in_stack_fffffffffffffd98;
  string *in_stack_fffffffffffffda0;
  string *in_stack_fffffffffffffdb0;
  char **in_stack_fffffffffffffdb8;
  char **in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffdc8;
  string local_218 [32];
  stringstream local_1f8 [16];
  undefined1 local_1e8 [32];
  char *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  LogLevel in_stack_fffffffffffffe54;
  string local_70 [32];
  undefined4 local_50;
  undefined1 local_3b;
  byte local_3a;
  byte local_39;
  string local_38;
  uint *local_18;
  string *local_8;
  
  local_18 = in_RDX;
  local_8 = in_RDI;
  copyToFormatString(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  lVar1 = std::__cxx11::string::find((char)&local_38,0x2a);
  local_39 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&local_38,0x73);
  local_3a = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)&local_38,100);
  local_3b = lVar1 != -1;
  if ((local_39 & 1) == 0) {
    if ((bool)local_3b) {
      in_stack_fffffffffffffd90 = &local_38;
      uVar2 = std::__cxx11::string::find((char)in_stack_fffffffffffffd90,100);
      IntegerFormatTrait<unsigned_int>::fmt();
      std::__cxx11::string::replace((ulong)in_stack_fffffffffffffd90,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<unsigned_int_const&>(in_stack_fffffffffffffdc8,(uint *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::operator+=(local_8,local_70);
      std::__cxx11::string::~string(local_70);
    }
    else if ((local_3a & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe54,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                 in_stack_fffffffffffffe38);
      }
      std::__cxx11::string::c_str();
      formatOne<unsigned_int_const&>(in_stack_fffffffffffffdc8,(uint *)in_stack_fffffffffffffdc0);
      std::__cxx11::string::operator+=(local_8,(string *)&stack0xfffffffffffffda0);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffda0);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_1f8);
      std::ostream::operator<<(local_1e8,*local_18);
      in_stack_fffffffffffffd88 = (uint *)std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      std::__cxx11::string::c_str();
      formatOne<char_const*>(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      std::__cxx11::string::operator+=(local_8,local_218);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffdc0);
      std::__cxx11::stringstream::~stringstream(local_1f8);
    }
    stringPrintfRecursive(in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
    local_50 = 0;
  }
  else {
    stringPrintfRecursiveWithPrecision<unsigned_int_const&>
              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
               in_stack_fffffffffffffd88);
    local_50 = 1;
  }
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&...args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same_v<std::decay_t<T>, float>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, double>)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same_v<std::decay_t<T>, bool>)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral_v<std::decay_t<T>>) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}